

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O2

void __thiscall
SharedTimedMutexTest_TryLockSharedFor_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(SharedTimedMutexTest_TryLockSharedFor_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  barrier *in_RCX;
  pointer *__ptr;
  char *message;
  anon_class_16_2_20c777b2_for_f f;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_128;
  duration<long,_std::ratio<1L,_1000L>_> local_120;
  AssertionResult gtest_ar;
  stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  sw;
  phaser phaser;
  TypeParam mtx;
  
  yamc::test::phaser::phaser(&phaser,5);
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&mtx);
  sw.start_.__d.__r = (time_point)std::chrono::_V2::system_clock::now();
  f.step = in_RCX;
  f.mtx = &mtx;
  yamc::test::
  task_runner<SharedTimedMutexTest_TryLockSharedFor_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>>::TestBody()::_lambda(unsigned_long)_1_>
            ((test *)0x5,(size_t)&phaser,f);
  local_128._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x190;
  local_120 = yamc::test::
              stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
              ::elapsed(&sw);
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)&gtest_ar,"std::chrono::milliseconds(200) * 2","sw.elapsed()",
             (duration<long,_std::ratio<1L,_1000L>_> *)&local_128,&local_120);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_128);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/rwlock_test.cpp"
               ,0x16d,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_120,(Message *)&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_120);
    if (local_128._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_128._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>::~basic_shared_timed_mutex
            ((basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer> *)&mtx);
  yamc::test::phaser::~phaser(&phaser);
  return;
}

Assistant:

TYPED_TEST(SharedTimedMutexTest, TryLockSharedFor)
{
  yamc::test::phaser phaser(1 + TEST_READER_THREADS);
  TypeParam mtx;
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(
    1 + TEST_READER_THREADS,
    [&](std::size_t id) {
      auto ph = phaser.get(id);
      if (id == 0) {
        // writer-threads
        ASSERT_NO_THROW(mtx.lock());
        ph.advance(1);  // p1
        WAIT_TICKS;
        ASSERT_NO_THROW(mtx.unlock());
      } else {
        // reader-threads
        ph.await();     // p1
        EXPECT_TRUE(mtx.try_lock_shared_for(TEST_NOT_TIMEOUT));
        WAIT_TICKS;
        EXPECT_NO_THROW(mtx.unlock_shared());
      }
    });
  EXPECT_LE(TEST_TICKS * 2, sw.elapsed());
}